

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O0

int gmlc::utilities::string_viewOps::trailingStringInt
              (string_view input,string_view *output,int defNum)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  size_type sVar4;
  int in_ECX;
  size_t *in_RDX;
  char *in_RSI;
  size_t in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  size_t length;
  size_type pos1;
  int num;
  undefined1 in_stack_ffffffffffffff58 [16];
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffff68;
  char *__n;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffff78;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  char *local_38;
  size_type local_30;
  int local_28;
  int local_24;
  size_t *local_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18._M_len = in_RDI;
  local_18._M_str = in_RSI;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if ((!bVar1) &&
     (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::back(&local_18), '/' < *pvVar3
     )) {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::back(&local_18);
    __n = in_stack_ffffffffffffff68._M_str;
    if (*pvVar3 < ':') {
      local_28 = local_24;
      local_40 = 10;
      local_38 = "0123456789";
      local_30 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                           (in_stack_ffffffffffffff58._8_8_,in_stack_ffffffffffffff68,
                            in_stack_ffffffffffffff58._0_8_);
      if (local_30 == 0xffffffffffffffff) {
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18);
        if (sVar4 < 0xb) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50);
          *local_20 = local_50._M_len;
          local_20[1] = (size_t)local_50._M_str;
          iVar2 = toIntSimple(in_stack_ffffffffffffff78);
          return iVar2;
        }
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18);
        local_30 = sVar4 - 10;
      }
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18);
      if (local_30 == sVar4 - 2) {
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::back(&local_18);
        local_28 = *pvVar3 + -0x30;
      }
      else if ((sVar4 < 0xb) || (sVar4 - 10 <= local_30)) {
        std::basic_string_view<char,_std::char_traits<char>_>::substr
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   in_stack_ffffffffffffff78._M_str,in_stack_ffffffffffffff78._M_len,(size_type)__n)
        ;
        local_28 = toIntSimple(in_stack_ffffffffffffff78);
      }
      else {
        in_stack_ffffffffffffff78 =
             std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)
                        in_stack_ffffffffffffff78._M_str,in_stack_ffffffffffffff78._M_len,
                        (size_type)__n);
        local_28 = toIntSimple(in_stack_ffffffffffffff78);
        local_30 = sVar4 - 10;
      }
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,local_30)
      ;
      if ((*pvVar3 == '_') ||
         (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             (&local_18,local_30), *pvVar3 == '#')) {
        bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_ffffffffffffff78._M_str,in_stack_ffffffffffffff78._M_len,
                           (size_type)__n);
        *local_20 = bVar5._M_len;
        local_20[1] = (size_t)bVar5._M_str;
      }
      else {
        bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_ffffffffffffff78._M_str,in_stack_ffffffffffffff78._M_len,
                           (size_type)__n);
        *local_20 = bVar5._M_len;
        local_20[1] = (size_t)bVar5._M_str;
      }
      return local_28;
    }
  }
  *local_20 = local_18._M_len;
  local_20[1] = (size_t)local_18._M_str;
  return local_24;
}

Assistant:

int trailingStringInt(
    std::string_view input,
    std::string_view& output,
    int defNum)
{
    if (input.empty() || (input.back() < '0' || input.back() > '9')) {
        output = input;
        return defNum;
    }
    int num = defNum;
    auto pos1 = input.find_last_not_of(digits);
    if (pos1 == std::string_view::npos)  // in case the whole thing is a number
    {
        if (input.length() <= 10) {
            output = std::string_view{};
            num = toIntSimple(input);
            return num;
        }
        pos1 = input.length() - 10;
    }
    size_t length = input.length();
    if (pos1 == length - 2) {
        num = input.back() - '0';
    } else if (length <= 10 || pos1 >= length - 10) {
        num = toIntSimple(input.substr(pos1 + 1));
    } else {
        num = toIntSimple(input.substr(length - 9));
        pos1 = length - 10;
    }

    if (input[pos1] == '_' || input[pos1] == '#') {
        output = input.substr(0, pos1);
    } else {
        output = input.substr(0, pos1 + 1);
    }

    return num;
}